

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vpmadd52luq(PDISASM pMyDisasm)

{
  if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01'))
     && ((pMyDisasm->Reserved_).EVEX.W == '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmadd52luq",0xc);
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    ArgsVEX(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vpmadd52luq(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmadd52luq");
        #endif
        GV.EVEX.tupletype = FULL;
        ArgsVEX(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}